

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock_test.cpp
# Opt level: O3

void __thiscall
SharedMutexTest_Lock_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>::
TestBody(SharedMutexTest_Lock_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>
         *this)

{
  anon_class_24_3_2b76d57f_for_f f;
  long lVar1;
  long lVar2;
  char *message;
  atomic<int> nread;
  TypeParam mtx;
  duration<long,_std::ratio<1L,_1000L>_> local_168;
  duration<long,_std::ratio<1L,_1000L>_> local_160;
  internal local_158 [8];
  undefined8 *local_150;
  atomic<int> local_144;
  undefined8 *local_140;
  undefined8 *puStack_138;
  atomic<int> *local_130;
  undefined8 local_128;
  undefined8 *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  condition_variable local_108 [48];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  condition_variable local_80 [48];
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  local_128 = 0;
  local_120 = (undefined8 *)operator_new(0x28);
  local_118 = local_120 + 5;
  *local_120 = 0;
  local_120[1] = 0;
  local_120[2] = 0;
  local_120[3] = 0;
  local_120[4] = 0;
  local_110 = local_118;
  std::condition_variable::condition_variable(local_108);
  local_b8 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_b0 = 0;
  local_a8 = &local_b0;
  local_a0 = &local_b0;
  std::condition_variable::condition_variable(local_80);
  local_30 = 0;
  local_40 = 0;
  uStack_38 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_144.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  lVar1 = std::chrono::_V2::system_clock::now();
  local_140 = &local_128;
  f.mtx = (TypeParam *)&local_b0;
  f.phaser = (phaser *)local_140;
  f.nread = &local_144;
  puStack_138 = &local_b0;
  local_130 = &local_144;
  yamc::test::
  task_runner<SharedMutexTest_Lock_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>>::TestBody()::_lambda(unsigned_long)_1_>
            (5,f);
  local_160.__r = (rep)&DAT_00000190;
  lVar2 = std::chrono::_V2::system_clock::now();
  local_168.__r = (lVar2 - lVar1) / 1000;
  testing::internal::
  CmpHelperLE<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>>
            (local_158,"std::chrono::milliseconds(200) * 2","sw.elapsed()",&local_160,&local_168);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if (local_150 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_150;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/rwlock_test.cpp"
               ,0x50,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((long *)local_160.__r != (long *)0x0) {
      (**(code **)(*(long *)local_160.__r + 8))();
    }
  }
  if (local_150 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_150 != local_150 + 2) {
      operator_delete((undefined8 *)*local_150);
    }
    operator_delete(local_150);
  }
  std::condition_variable::~condition_variable(local_80);
  std::condition_variable::~condition_variable(local_108);
  if (local_120 != (undefined8 *)0x0) {
    operator_delete(local_120);
  }
  return;
}

Assistant:

TYPED_TEST(SharedMutexTest, Lock)
{
  yamc::test::phaser phaser(1 + TEST_READER_THREADS);
  TypeParam mtx;
  std::atomic<int> nread = {};
  yamc::test::stopwatch<> sw;
  yamc::test::task_runner(
    1 + TEST_READER_THREADS,
    [&](std::size_t id) {
      auto ph = phaser.get(id);
      if (id == 0) {
        // writer-thread
        ph.await();     // p1
        EXPECT_NO_THROW(mtx.lock());
        EXPECT_EQ(TEST_READER_THREADS, nread);
        WAIT_TICKS;
        EXPECT_NO_THROW(mtx.unlock());
      } else {
        // reader-threads
        ASSERT_NO_THROW(mtx.lock_shared());
        ph.advance(1);  // p1
        ++nread;
        WAIT_TICKS;
        ASSERT_NO_THROW(mtx.unlock_shared());
      }
    });
  EXPECT_LE(TEST_TICKS * 2, sw.elapsed());
}